

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int vm_builtin_gettype(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char *zString;
  
  if (nArg < 1) {
    zString = "null";
  }
  else {
    zString = jx9MemObjTypeDump(*apArg);
  }
  jx9_value_string(pCtx->pRet,zString,-1);
  return 0;
}

Assistant:

static int vm_builtin_gettype(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zType = "null";
	if( nArg > 0 ){
		zType = jx9MemObjTypeDump(apArg[0]);
	}
	/* Return the variable type */
	jx9_result_string(pCtx, zType, -1/*Compute length automatically*/);
	return SXRET_OK;
}